

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

RPCHelpMan * wallet::restorewallet(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_02;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_03;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_ffffffffffffedd8;
  uint uVar2;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  *this;
  RPCArg *this_00;
  anon_class_1_0_00000001 *in_stack_ffffffffffffede0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffede8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffedf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee10;
  allocator<char> *in_stack_ffffffffffffee18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *in_stack_ffffffffffffee20;
  undefined7 in_stack_ffffffffffffee28;
  undefined1 in_stack_ffffffffffffee2f;
  string *in_stack_ffffffffffffee30;
  undefined7 in_stack_ffffffffffffee38;
  undefined1 in_stack_ffffffffffffee3f;
  undefined4 in_stack_ffffffffffffee40;
  Type in_stack_ffffffffffffee44;
  string *in_stack_ffffffffffffee48;
  undefined4 in_stack_ffffffffffffee50;
  Type in_stack_ffffffffffffee54;
  undefined4 in_stack_ffffffffffffee58;
  Type in_stack_ffffffffffffee5c;
  RPCResult *in_stack_ffffffffffffee60;
  undefined1 *local_1138;
  undefined1 *local_1120;
  undefined1 *local_1108;
  undefined1 *local_10f0;
  RPCExamples *in_stack_ffffffffffffef20;
  undefined1 *puVar3;
  RPCResults *in_stack_ffffffffffffef28;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  RPCMethodImpl *fun;
  undefined1 local_f10 [39];
  undefined1 local_ee9;
  undefined1 local_ecb [28];
  allocator<char> local_eaf;
  allocator<char> local_eae;
  allocator<char> local_ead;
  allocator<char> local_eac;
  allocator<char> local_eab [33];
  allocator<char> local_e8a;
  allocator<char> local_e89 [31];
  allocator<char> local_e6a;
  allocator<char> local_e69;
  size_type local_e68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e60;
  allocator<char> local_e42;
  allocator<char> local_e41 [31];
  allocator<char> local_e22;
  allocator<char> local_e21 [32];
  allocator<char> local_e01;
  undefined4 local_e00;
  allocator<char> local_dfa;
  allocator<char> local_df9;
  undefined4 local_df8;
  allocator<char> local_df2;
  allocator<char> local_df1;
  undefined4 local_df0;
  allocator<char> local_de9 [31];
  allocator<char> local_dca;
  RPCMethodImpl local_dc9 [11];
  undefined1 local_c60 [64];
  undefined1 local_c20 [360];
  undefined1 local_ab8 [448];
  undefined1 local_8f8 [136];
  undefined1 local_870 [128];
  undefined1 local_7f0 [272];
  undefined1 local_6e0 [200];
  undefined1 local_618;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined1 local_5d8;
  undefined1 local_5d7;
  undefined1 local_530;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined1 local_4f0;
  undefined1 local_4ef;
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fun = local_dc9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  local_df0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffede8,(Optional *)in_stack_ffffffffffffede0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffedf0);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffedd8);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee44,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffee3f,in_stack_ffffffffffffee38),
                 in_stack_ffffffffffffee30,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  local_df8 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffede8,(Optional *)in_stack_ffffffffffffede0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  local_530 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffedf0);
  local_508 = 0;
  uStack_500 = 0;
  local_4f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffedd8);
  local_4f0 = 0;
  local_4ef = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee44,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffee3f,in_stack_ffffffffffffee38),
                 in_stack_ffffffffffffee30,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  local_e00 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffede8,(Optional *)in_stack_ffffffffffffede0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  local_618 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffedf0);
  local_5f0 = 0;
  uStack_5e8 = 0;
  local_5e0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffedd8);
  local_5d8 = 0;
  local_5d7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee44,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffee3f,in_stack_ffffffffffffee38),
                 in_stack_ffffffffffffee30,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28));
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_ffffffffffffedd8);
  __l._M_len._0_7_ = in_stack_ffffffffffffee28;
  __l._M_array = (iterator)in_stack_ffffffffffffee20;
  __l._M_len._7_1_ = in_stack_ffffffffffffee2f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffee18,__l,
             (allocator_type *)in_stack_ffffffffffffee10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  local_e68 = 0;
  aStack_e60._M_allocated_capacity = 0;
  aStack_e60._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffedd8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffee60,in_stack_ffffffffffffee5c,
             (string *)CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
             in_stack_ffffffffffffee48,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffee44,in_stack_ffffffffffffee40),
             (bool)in_stack_ffffffffffffee3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  local_eab[3] = (allocator<char>)0x0;
  local_eab[4] = (allocator<char>)0x0;
  local_eab[5] = (allocator<char>)0x0;
  local_eab[6] = (allocator<char>)0x0;
  local_eab[7] = (allocator<char>)0x0;
  local_eab[8] = (allocator<char>)0x0;
  local_eab[9] = (allocator<char>)0x0;
  local_eab[10] = (allocator<char>)0x0;
  local_eab[0xb] = (allocator<char>)0x0;
  local_eab[0xc] = (allocator<char>)0x0;
  local_eab[0xd] = (allocator<char>)0x0;
  local_eab[0xe] = (allocator<char>)0x0;
  local_eab[0xf] = (allocator<char>)0x0;
  local_eab[0x10] = (allocator<char>)0x0;
  local_eab[0x11] = (allocator<char>)0x0;
  local_eab[0x12] = (allocator<char>)0x0;
  local_eab[0x13] = (allocator<char>)0x0;
  local_eab[0x14] = (allocator<char>)0x0;
  local_eab[0x15] = (allocator<char>)0x0;
  local_eab[0x16] = (allocator<char>)0x0;
  local_eab[0x17] = (allocator<char>)0x0;
  local_eab[0x18] = (allocator<char>)0x0;
  local_eab[0x19] = (allocator<char>)0x0;
  local_eab[0x1a] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffedd8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffee60,in_stack_ffffffffffffee5c,
             (string *)CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
             in_stack_ffffffffffffee48,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffee44,in_stack_ffffffffffffee40),
             (bool)in_stack_ffffffffffffee3f);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffedd8);
  uVar2 = (uint)((ulong)in_stack_ffffffffffffedd8 >> 0x20);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffee28;
  __l_00._M_array = (iterator)in_stack_ffffffffffffee20;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffee2f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee18,__l_00,
             (allocator_type *)in_stack_ffffffffffffee10);
  this = (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
          *)((ulong)uVar2 << 0x20);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffee5c,in_stack_ffffffffffffee58),
             in_stack_ffffffffffffee54,in_stack_ffffffffffffee48,
             SUB41(in_stack_ffffffffffffee44 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffee3f,in_stack_ffffffffffffee38),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee30,
             (bool)in_stack_ffffffffffffee2f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffee28;
  __l_01._M_array = (iterator)in_stack_ffffffffffffee20;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffee2f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee18,__l_01,
             (allocator_type *)in_stack_ffffffffffffee10);
  RPCResult::RPCResult
            (in_stack_ffffffffffffee60,in_stack_ffffffffffffee5c,
             (string *)CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
             in_stack_ffffffffffffee48,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffee44,in_stack_ffffffffffffee40),
             (bool)in_stack_ffffffffffffee3f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffee5c,in_stack_ffffffffffffee58),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  HelpExampleCli(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  HelpExampleRpc(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
  std::operator+(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[11],_true>
            (in_stack_ffffffffffffee20,(char (*) [12])in_stack_ffffffffffffee18,
             (char (*) [11])in_stack_ffffffffffffee10);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[30],_true>
            (in_stack_ffffffffffffee20,(char (*) [12])in_stack_ffffffffffffee18,
             (char (*) [30])in_stack_ffffffffffffee10);
  local_ecb[2] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[16],_bool,_true>
            (in_stack_ffffffffffffee20,(char (*) [16])in_stack_ffffffffffffee18,
             (bool *)in_stack_ffffffffffffee10);
  this_01 = (RPCHelpMan *)(local_ecb + 1);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::allocator(this);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffee28;
  __l_02._M_array = in_stack_ffffffffffffee20;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffee2f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)in_stack_ffffffffffffee18,__l_02,(allocator_type *)in_stack_ffffffffffffee10);
  HelpExampleCliNamed(in_stack_ffffffffffffee30,
                      (RPCArgList *)CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28));
  std::operator+(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
  name = (string *)local_ecb;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffee2f,in_stack_ffffffffffffee28),
             (char *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[11],_true>
            (in_stack_ffffffffffffee20,(char (*) [12])in_stack_ffffffffffffee18,
             (char (*) [11])in_stack_ffffffffffffee10);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[30],_true>
            (in_stack_ffffffffffffee20,(char (*) [12])in_stack_ffffffffffffee18,
             (char (*) [30])in_stack_ffffffffffffee10);
  local_ee9 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[16],_bool,_true>
            (in_stack_ffffffffffffee20,(char (*) [16])in_stack_ffffffffffffee18,
             (bool *)in_stack_ffffffffffffee10);
  description = (string *)(local_f10 + 0x26);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::allocator(this);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffee28;
  __l_03._M_array = in_stack_ffffffffffffee20;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffee2f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)in_stack_ffffffffffffee18,__l_03,(allocator_type *)in_stack_ffffffffffffee10);
  HelpExampleRpcNamed(&in_stack_ffffffffffffee20->first,(RPCArgList *)in_stack_ffffffffffffee18);
  std::operator+(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x15d215e);
  this_00 = (RPCArg *)local_f10;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::restorewallet()::__0,void>(in_stack_ffffffffffffede8,in_stack_ffffffffffffede0);
  RPCHelpMan::RPCHelpMan
            (this_01,name,description,(vector<RPCArg,_std::allocator<RPCArg>_> *)this_00,
             in_stack_ffffffffffffef28,in_stack_ffffffffffffef20,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)in_stack_ffffffffffffede8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                *)this_00);
  puVar3 = (undefined1 *)((long)&local_dc9[0].super__Function_base._M_functor + 1);
  puVar1 = local_c60;
  do {
    puVar1 = puVar1 + -0x78;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)this_00);
  } while (puVar1 != puVar3);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_ecb);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)in_stack_ffffffffffffede8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                *)this_00);
  local_10f0 = local_ab8;
  do {
    local_10f0 = local_10f0 + -0x78;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)this_00);
  } while (local_10f0 != local_c20);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_eaf);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_eae);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_ead);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_eac);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_eab);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffede8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1108 = local_6e0;
  do {
    local_1108 = local_1108 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1108 != local_7f0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffede8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1120 = local_870;
  do {
    local_1120 = local_1120 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1120 != local_8f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffede8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_e8a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_e89);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_e6a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_e69);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffede8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_e42);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_e41);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_e22);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_e21);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffede8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_1138 = local_48;
  do {
    local_1138 = local_1138 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1138 != local_360);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_e01);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_dfa);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_df9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_df2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_df1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_de9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_dca);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_dc9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan restorewallet()
{
    return RPCHelpMan{
        "restorewallet",
        "\nRestores and loads a wallet from backup.\n"
        "\nThe rescan is significantly faster if a descriptor wallet is restored"
        "\nand block filters are available (using startup option \"-blockfilterindex=1\").\n",
        {
            {"wallet_name", RPCArg::Type::STR, RPCArg::Optional::NO, "The name that will be applied to the restored wallet"},
            {"backup_file", RPCArg::Type::STR, RPCArg::Optional::NO, "The backup file that will be used to restore the wallet."},
            {"load_on_startup", RPCArg::Type::BOOL, RPCArg::Optional::OMITTED, "Save wallet name to persistent settings and load on startup. True to add wallet to startup list, false to remove, null to leave unchanged."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "name", "The wallet name if restored successfully."},
                {RPCResult::Type::ARR, "warnings", /*optional=*/true, "Warning messages, if any, related to restoring and loading the wallet.",
                {
                    {RPCResult::Type::STR, "", ""},
                }},
            }
        },
        RPCExamples{
            HelpExampleCli("restorewallet", "\"testwallet\" \"home\\backups\\backup-file.bak\"")
            + HelpExampleRpc("restorewallet", "\"testwallet\" \"home\\backups\\backup-file.bak\"")
            + HelpExampleCliNamed("restorewallet", {{"wallet_name", "testwallet"}, {"backup_file", "home\\backups\\backup-file.bak\""}, {"load_on_startup", true}})
            + HelpExampleRpcNamed("restorewallet", {{"wallet_name", "testwallet"}, {"backup_file", "home\\backups\\backup-file.bak\""}, {"load_on_startup", true}})
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{

    WalletContext& context = EnsureWalletContext(request.context);

    auto backup_file = fs::u8path(request.params[1].get_str());

    std::string wallet_name = request.params[0].get_str();

    std::optional<bool> load_on_start = request.params[2].isNull() ? std::nullopt : std::optional<bool>(request.params[2].get_bool());

    DatabaseStatus status;
    bilingual_str error;
    std::vector<bilingual_str> warnings;

    const std::shared_ptr<CWallet> wallet = RestoreWallet(context, backup_file, wallet_name, load_on_start, status, error, warnings);

    HandleWalletError(wallet, status, error);

    UniValue obj(UniValue::VOBJ);
    obj.pushKV("name", wallet->GetName());
    PushWarnings(warnings, obj);

    return obj;

},
    };
}